

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O0

void alcProcessContext(ALCcontext *_ctx)

{
  DeviceWrapper *local_30;
  ALCcontext *local_28;
  ContextWrapper *ctx;
  ALCcontext *_ctx_local;
  
  APILOCK();
  IO_ENTRYINFO(ALEE_alcProcessContext);
  IO_PTR(_ctx);
  if (_ctx == (ALCcontext *)0x0) {
    local_28 = (ALCcontext *)0x0;
  }
  else {
    local_28 = *(ALCcontext **)_ctx;
  }
  (*REAL_alcProcessContext)(local_28);
  if (_ctx == (ALCcontext *)0x0) {
    local_30 = (DeviceWrapper *)0x0;
  }
  else {
    local_30 = *(DeviceWrapper **)(_ctx + 8);
  }
  check_alc_error_events(local_30);
  check_al_async_states();
  APIUNLOCK();
  return;
}

Assistant:

void alcProcessContext(ALCcontext *_ctx)
{
    ContextWrapper *ctx = (ContextWrapper *) _ctx;
    IO_START(alcProcessContext);
    IO_PTR(ctx);
    REAL_alcProcessContext(ctx ? ctx->ctx : NULL);
    IO_END_ALC(ctx ? ctx->device : NULL);
}